

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O1

void __thiscall
Reducer::tryToRemoveFunctions(std::vector<wasm::Name,std::allocator<wasm::Name>>)::
FunctionReferenceRemover::visitExport(wasm::Export__(void *this,Export *curr)

{
  iterator __position;
  char *pcVar1;
  size_type sVar2;
  
  if (curr[0x28] == (Export)0x0) {
    sVar2 = std::
            _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)((long)this + 0xd8),(key_type *)(curr + 0x18));
    if (sVar2 != 0) {
      __position._M_current = *(Name **)((long)this + 0x118);
      if (__position._M_current == *(Name **)((long)this + 0x120)) {
        std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                  ((vector<wasm::Name,std::allocator<wasm::Name>> *)((long)this + 0x110),__position,
                   (Name *)curr);
        return;
      }
      pcVar1 = *(char **)(curr + 8);
      ((__position._M_current)->super_IString).str._M_len = *(size_t *)curr;
      ((__position._M_current)->super_IString).str._M_str = pcVar1;
      *(long *)((long)this + 0x118) = *(long *)((long)this + 0x118) + 0x10;
    }
  }
  return;
}

Assistant:

void visitExport(Export* curr) {
        if (auto* name = curr->getInternalName(); name && names.count(*name)) {
          exportsToRemove.push_back(curr->name);
        }
      }